

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::genGatherPrograms
               (SourceCollections *programCollection,GatherCaseBaseParams *baseParams,
               vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
               *iterations)

{
  ChannelOrder CVar1;
  TextureType_conflict TVar2;
  GatherType GVar3;
  OffsetSize OVar4;
  ImageBackingMode IVar5;
  pointer pGVar6;
  pointer pGVar7;
  DataType DVar8;
  ulong uVar9;
  long *plVar10;
  ostream *poVar11;
  ProgramSources *pPVar12;
  undefined8 *puVar13;
  char *pcVar14;
  size_t sVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_type *psVar16;
  long *plVar17;
  ulong *puVar18;
  long lVar19;
  undefined8 uVar20;
  _Alloc_hider _Var21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  string texCoordType_1;
  string texCoordType;
  string outType;
  string funcCall;
  string refZExpr;
  ostringstream vert_1;
  VertexSource vert;
  string local_5b0;
  size_type *local_590;
  value_type local_588;
  ulong *local_568;
  long local_560;
  ulong local_558;
  long lStack_550;
  int local_544;
  GatherCaseBaseParams *local_540;
  long local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_530;
  long local_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_520;
  ulong local_510;
  int local_504;
  int local_500;
  GatherType local_4fc;
  ulong *local_4f8;
  long local_4f0;
  ulong local_4e8;
  long lStack_4e0;
  char *local_4d8;
  long local_4d0;
  char local_4c8;
  undefined7 uStack_4c7;
  ulong local_4b8;
  long *local_4b0;
  undefined8 local_4a8;
  long local_4a0;
  undefined8 uStack_498;
  long *local_490;
  undefined8 local_488;
  long local_480;
  undefined8 uStack_478;
  long *local_470;
  undefined8 local_468;
  long local_460;
  undefined8 uStack_458;
  long *local_450;
  undefined8 local_448;
  long local_440;
  undefined8 uStack_438;
  long *local_430;
  undefined8 local_428;
  long local_420;
  undefined8 uStack_418;
  long *local_410;
  undefined8 local_408;
  long local_400;
  undefined8 uStack_3f8;
  ulong local_3f0;
  ulong *local_3e8;
  long local_3e0;
  ulong local_3d8;
  long lStack_3d0;
  ulong *local_3c8;
  long local_3c0;
  ulong local_3b8;
  long lStack_3b0;
  ulong *local_3a8;
  long local_3a0;
  ulong local_398;
  long lStack_390;
  ulong *local_388;
  long local_380;
  ulong local_378;
  long lStack_370;
  ulong *local_368;
  long local_360;
  ulong local_358;
  long lStack_350;
  ulong *local_348;
  long local_340;
  ulong local_338;
  long lStack_330;
  ulong *local_328;
  long local_320;
  ulong local_318 [2];
  ulong *local_308;
  long local_300;
  ulong local_2f8 [2];
  ulong *local_2e8;
  long local_2e0;
  ulong local_2d8 [2];
  ulong *local_2c8;
  long local_2c0;
  ulong local_2b8 [2];
  ulong *local_2a8;
  long local_2a0;
  ulong local_298 [2];
  ulong *local_288;
  long local_280;
  ulong local_278 [2];
  ulong *local_268;
  long local_260;
  ulong local_258 [2];
  SourceCollections *local_248;
  ulong local_240;
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  string local_1d8 [3];
  ios_base local_168 [264];
  vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  *local_60;
  uint local_58;
  value_type local_50;
  
  pGVar6 = (iterations->
           super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pGVar7 = (iterations->
           super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_248 = programCollection;
  local_60 = iterations;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"v_normalizedCoord.x","");
  uVar9 = (ulong)baseParams->offsetSize;
  if (uVar9 < 3) {
    local_504 = *(int *)(&DAT_00b547a8 + uVar9 * 4);
    local_544 = *(int *)(&DAT_00b547b4 + uVar9 * 4);
  }
  else {
    local_544 = 0;
    local_504 = -1;
  }
  local_4fc = baseParams->gatherType;
  bVar22 = true;
  if (local_4fc != GATHERTYPE_OFFSET_DYNAMIC) {
    bVar22 = ((baseParams->textureFormat).order - D & 0xfffffffd) == 0;
  }
  CVar1 = (baseParams->textureFormat).order;
  TVar2 = baseParams->textureType;
  bVar23 = CVar1 == D;
  bVar24 = CVar1 == DS;
  local_540 = baseParams;
  if ((bVar24) || (CVar1 == D)) {
    local_510 = 0x5e;
    if (TVar2 < TEXTURETYPE_LAST) {
      local_510 = (ulong)*(uint *)(&DAT_00b547c0 + (ulong)TVar2 * 4);
    }
  }
  else if ((ulong)TVar2 == 2) {
    DVar8 = glu::getSamplerCubeType(baseParams->textureFormat);
    local_510 = CONCAT44(extraout_var_01,DVar8);
  }
  else if (TVar2 == TEXTURETYPE_2D_ARRAY) {
    DVar8 = glu::getSampler2DArrayType(baseParams->textureFormat);
    local_510 = CONCAT44(extraout_var_00,DVar8);
  }
  else {
    local_510 = 0x5e;
    if (TVar2 == TEXTURETYPE_2D) {
      DVar8 = glu::getSampler2DType(baseParams->textureFormat);
      local_510 = CONCAT44(extraout_var,DVar8);
    }
  }
  local_500 = -1;
  if ((ulong)local_540->textureType < 3) {
    local_500 = *(int *)(&DAT_00b547cc + (ulong)local_540->textureType * 4);
  }
  bVar25 = local_4fc == GATHERTYPE_OFFSET_DYNAMIC;
  GVar3 = local_540->gatherType;
  OVar4 = local_540->offsetSize;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
  std::ostream::operator<<(local_1d8,local_500);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
  std::ios_base::~ios_base(local_168);
  plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_5b0,0,(char *)0x0,0xb4dcfe);
  local_590 = &local_588._M_string_length;
  psVar16 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar16) {
    local_588._M_string_length = *psVar16;
    local_588.field_2._M_allocated_capacity = plVar10[3];
  }
  else {
    local_588._M_string_length = *psVar16;
    local_590 = (size_type *)*plVar10;
  }
  local_588._M_dataplus._M_p = (pointer)plVar10[1];
  *plVar10 = (long)psVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"#version 310 es\n",0x10);
  if ((GVar3 & ~GATHERTYPE_OFFSET) == GATHERTYPE_OFFSET_DYNAMIC ||
      OVar4 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"#extension GL_EXT_gpu_shader5 : require\n",0x28);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d8,
             "\nlayout (location = 0) in highp vec2 a_position;\nlayout (location = 1) in highp ",
             0x50);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d8,(char *)local_590,(long)local_588._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," a_texCoord;\n",0xd);
  if (bVar25 || (bVar23 || bVar24)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,
               "layout (location = 2) in highp vec2 a_normalizedCoord; // (0,0) to (1,1)\n",0x49);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d8,"\nlayout (location = 0) out highp ",0x21);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d8,(char *)local_590,(long)local_588._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," v_texCoord;\n",0xd);
  if (bVar25 || (bVar23 || bVar24)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"layout (location = 1) out highp vec2 v_normalizedCoord;\n",0x38
              );
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d8,
             "\nvoid main (void)\n{\n\tgl_Position = vec4(a_position.x, a_position.y, 0.0, 1.0);\n\tv_texCoord = a_texCoord;\n"
             ,0x69);
  if (bVar25 || (bVar23 || bVar24)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"\tv_normalizedCoord = a_normalizedCoord;\n",0x28);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"}\n",2);
  std::__cxx11::stringbuf::str();
  local_58 = 0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_5b0._M_dataplus._M_p,
             local_5b0._M_dataplus._M_p + local_5b0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
  std::ios_base::~ios_base(local_168);
  if (local_590 != &local_588._M_string_length) {
    operator_delete(local_590,local_588._M_string_length + 1);
  }
  local_1d8[0]._M_dataplus._M_p = (pointer)&local_1d8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"vert","");
  pPVar12 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_248->glslSources,local_1d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar12->sources + local_58,&local_50);
  local_4b8 = ((long)pGVar6 - (long)pGVar7 >> 2) * -0x71c71c71c71c71c7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8[0]._M_dataplus._M_p != &local_1d8[0].field_2) {
    operator_delete(local_1d8[0]._M_dataplus._M_p,local_1d8[0].field_2._M_allocated_capacity + 1);
  }
  if (0 < (int)(uint)local_4b8) {
    local_4b8 = (ulong)((uint)local_4b8 & 0x7fffffff);
    local_544 = local_544 - local_504;
    local_240 = (ulong)((int)local_510 - 0x28);
    local_538 = 0x1c;
    local_3f0 = 0;
    do {
      pGVar6 = (local_60->
               super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
               )._M_impl.super__Vector_impl_data._M_start;
      GVar3 = local_540->gatherType;
      OVar4 = local_540->offsetSize;
      IVar5 = local_540->sparseCase;
      local_4d8 = &local_4c8;
      local_4d0 = 0;
      local_4c8 = '\0';
      if (GVar3 < GATHERTYPE_LAST) {
        std::__cxx11::string::append((char *)&local_4d8);
      }
      std::__cxx11::string::append((char *)&local_4d8);
      CVar1 = (local_540->textureFormat).order;
      if ((CVar1 == DS) || (CVar1 == D)) {
        std::operator+(local_1d8,", ",&local_218);
        std::__cxx11::string::_M_append((char *)&local_4d8,(ulong)local_1d8[0]._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8[0]._M_dataplus._M_p != &local_1d8[0].field_2) {
          operator_delete(local_1d8[0]._M_dataplus._M_p,
                          local_1d8[0].field_2._M_allocated_capacity + 1);
        }
      }
      if (2 < GVar3 - GATHERTYPE_OFFSET) goto LAB_0065dba4;
      std::__cxx11::string::append((char *)&local_4d8);
      if (GVar3 == GATHERTYPE_OFFSETS) {
        local_1f8[0] = &local_1e8;
        std::__cxx11::string::_M_construct((ulong)local_1f8,'\x01');
        plVar10 = (long *)std::__cxx11::string::replace((ulong)local_1f8,0,(char *)0x0,0xb54e28);
        local_238 = &local_228;
        plVar17 = plVar10 + 2;
        if ((long *)*plVar10 == plVar17) {
          local_228 = *plVar17;
          lStack_220 = plVar10[3];
        }
        else {
          local_228 = *plVar17;
          local_238 = (long *)*plVar10;
        }
        local_230 = plVar10[1];
        *plVar10 = (long)plVar17;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_238);
        local_3e8 = &local_3d8;
        puVar18 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar18) {
          local_3d8 = *puVar18;
          lStack_3d0 = plVar10[3];
        }
        else {
          local_3d8 = *puVar18;
          local_3e8 = (ulong *)*plVar10;
        }
        local_3e0 = plVar10[1];
        *plVar10 = (long)puVar18;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
        tcu::operator<<((ostream *)local_1d8,
                        (Vector<int,_2> *)((long)pGVar6->offsets[0].m_data + local_538 + -0x1c));
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
        std::ios_base::~ios_base(local_168);
        uVar9 = 0xf;
        if (local_3e8 != &local_3d8) {
          uVar9 = local_3d8;
        }
        if (uVar9 < (ulong)(local_260 + local_3e0)) {
          uVar9 = 0xf;
          if (local_268 != local_258) {
            uVar9 = local_258[0];
          }
          if (uVar9 < (ulong)(local_260 + local_3e0)) goto LAB_0065ca05;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_3e8);
        }
        else {
LAB_0065ca05:
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_3e8,(ulong)local_268);
        }
        local_4b0 = &local_4a0;
        plVar10 = puVar13 + 2;
        if ((long *)*puVar13 == plVar10) {
          local_4a0 = *plVar10;
          uStack_498 = puVar13[3];
        }
        else {
          local_4a0 = *plVar10;
          local_4b0 = (long *)*puVar13;
        }
        local_4a8 = puVar13[1];
        *puVar13 = plVar10;
        puVar13[1] = 0;
        *(undefined1 *)plVar10 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_4b0);
        local_3c8 = &local_3b8;
        puVar18 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar18) {
          local_3b8 = *puVar18;
          lStack_3b0 = plVar10[3];
        }
        else {
          local_3b8 = *puVar18;
          local_3c8 = (ulong *)*plVar10;
        }
        local_3c0 = plVar10[1];
        *plVar10 = (long)puVar18;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        local_2e8 = local_2d8;
        std::__cxx11::string::_M_construct((ulong)&local_2e8,'\x01');
        uVar9 = 0xf;
        if (local_3c8 != &local_3b8) {
          uVar9 = local_3b8;
        }
        if (uVar9 < (ulong)(local_2e0 + local_3c0)) {
          uVar9 = 0xf;
          if (local_2e8 != local_2d8) {
            uVar9 = local_2d8[0];
          }
          if (uVar9 < (ulong)(local_2e0 + local_3c0)) goto LAB_0065cb73;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_2e8,0,(char *)0x0,(ulong)local_3c8);
        }
        else {
LAB_0065cb73:
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_3c8,(ulong)local_2e8);
        }
        local_490 = &local_480;
        plVar10 = puVar13 + 2;
        if ((long *)*puVar13 == plVar10) {
          local_480 = *plVar10;
          uStack_478 = puVar13[3];
        }
        else {
          local_480 = *plVar10;
          local_490 = (long *)*puVar13;
        }
        local_488 = puVar13[1];
        *puVar13 = plVar10;
        puVar13[1] = 0;
        *(undefined1 *)plVar10 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_490);
        local_3a8 = &local_398;
        puVar18 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar18) {
          local_398 = *puVar18;
          lStack_390 = plVar10[3];
        }
        else {
          local_398 = *puVar18;
          local_3a8 = (ulong *)*plVar10;
        }
        local_3a0 = plVar10[1];
        *plVar10 = (long)puVar18;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
        tcu::operator<<((ostream *)local_1d8,
                        (Vector<int,_2> *)((long)pGVar6->offsets[0].m_data + local_538 + -0x14));
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
        std::ios_base::~ios_base(local_168);
        uVar9 = 0xf;
        if (local_3a8 != &local_398) {
          uVar9 = local_398;
        }
        if (uVar9 < (ulong)(local_280 + local_3a0)) {
          uVar9 = 0xf;
          if (local_288 != local_278) {
            uVar9 = local_278[0];
          }
          if (uVar9 < (ulong)(local_280 + local_3a0)) goto LAB_0065cd0b;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,(ulong)local_3a8);
        }
        else {
LAB_0065cd0b:
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_3a8,(ulong)local_288);
        }
        local_470 = &local_460;
        plVar10 = puVar13 + 2;
        if ((long *)*puVar13 == plVar10) {
          local_460 = *plVar10;
          uStack_458 = puVar13[3];
        }
        else {
          local_460 = *plVar10;
          local_470 = (long *)*puVar13;
        }
        local_468 = puVar13[1];
        *puVar13 = plVar10;
        puVar13[1] = 0;
        *(undefined1 *)plVar10 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_470);
        local_388 = &local_378;
        puVar18 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar18) {
          local_378 = *puVar18;
          lStack_370 = plVar10[3];
        }
        else {
          local_378 = *puVar18;
          local_388 = (ulong *)*plVar10;
        }
        local_380 = plVar10[1];
        *plVar10 = (long)puVar18;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        local_308 = local_2f8;
        std::__cxx11::string::_M_construct((ulong)&local_308,'\x01');
        uVar9 = 0xf;
        if (local_388 != &local_378) {
          uVar9 = local_378;
        }
        if (uVar9 < (ulong)(local_300 + local_380)) {
          uVar9 = 0xf;
          if (local_308 != local_2f8) {
            uVar9 = local_2f8[0];
          }
          if (uVar9 < (ulong)(local_300 + local_380)) goto LAB_0065ce79;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_308,0,(char *)0x0,(ulong)local_388);
        }
        else {
LAB_0065ce79:
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_388,(ulong)local_308);
        }
        local_450 = &local_440;
        plVar10 = puVar13 + 2;
        if ((long *)*puVar13 == plVar10) {
          local_440 = *plVar10;
          uStack_438 = puVar13[3];
        }
        else {
          local_440 = *plVar10;
          local_450 = (long *)*puVar13;
        }
        local_448 = puVar13[1];
        *puVar13 = plVar10;
        puVar13[1] = 0;
        *(undefined1 *)plVar10 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_450);
        local_368 = &local_358;
        puVar18 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar18) {
          local_358 = *puVar18;
          lStack_350 = plVar10[3];
        }
        else {
          local_358 = *puVar18;
          local_368 = (ulong *)*plVar10;
        }
        local_360 = plVar10[1];
        *plVar10 = (long)puVar18;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
        tcu::operator<<((ostream *)local_1d8,
                        (Vector<int,_2> *)((long)pGVar6->offsets[0].m_data + local_538 + -0xc));
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
        std::ios_base::~ios_base(local_168);
        uVar9 = 0xf;
        if (local_368 != &local_358) {
          uVar9 = local_358;
        }
        if (uVar9 < (ulong)(local_2a0 + local_360)) {
          uVar9 = 0xf;
          if (local_2a8 != local_298) {
            uVar9 = local_298[0];
          }
          if (uVar9 < (ulong)(local_2a0 + local_360)) goto LAB_0065d011;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_2a8,0,(char *)0x0,(ulong)local_368);
        }
        else {
LAB_0065d011:
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_368,(ulong)local_2a8);
        }
        local_430 = &local_420;
        plVar10 = puVar13 + 2;
        if ((long *)*puVar13 == plVar10) {
          local_420 = *plVar10;
          uStack_418 = puVar13[3];
        }
        else {
          local_420 = *plVar10;
          local_430 = (long *)*puVar13;
        }
        local_428 = puVar13[1];
        *puVar13 = plVar10;
        puVar13[1] = 0;
        *(undefined1 *)plVar10 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_430);
        local_348 = &local_338;
        puVar18 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar18) {
          local_338 = *puVar18;
          lStack_330 = plVar10[3];
        }
        else {
          local_338 = *puVar18;
          local_348 = (ulong *)*plVar10;
        }
        local_340 = plVar10[1];
        *plVar10 = (long)puVar18;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        local_328 = local_318;
        std::__cxx11::string::_M_construct((ulong)&local_328,'\x01');
        uVar9 = 0xf;
        if (local_348 != &local_338) {
          uVar9 = local_338;
        }
        if (uVar9 < (ulong)(local_320 + local_340)) {
          uVar9 = 0xf;
          if (local_328 != local_318) {
            uVar9 = local_318[0];
          }
          if (uVar9 < (ulong)(local_320 + local_340)) goto LAB_0065d17f;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_328,0,(char *)0x0,(ulong)local_348);
        }
        else {
LAB_0065d17f:
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_348,(ulong)local_328);
        }
        local_410 = &local_400;
        plVar10 = puVar13 + 2;
        if ((long *)*puVar13 == plVar10) {
          local_400 = *plVar10;
          uStack_3f8 = puVar13[3];
        }
        else {
          local_400 = *plVar10;
          local_410 = (long *)*puVar13;
        }
        local_408 = puVar13[1];
        *puVar13 = plVar10;
        puVar13[1] = 0;
        *(undefined1 *)plVar10 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_410);
        local_4f8 = &local_4e8;
        puVar18 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar18) {
          local_4e8 = *puVar18;
          lStack_4e0 = plVar10[3];
        }
        else {
          local_4e8 = *puVar18;
          local_4f8 = (ulong *)*plVar10;
        }
        local_4f0 = plVar10[1];
        *plVar10 = (long)puVar18;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
        tcu::operator<<((ostream *)local_1d8,
                        (Vector<int,_2> *)((long)pGVar6->offsets[0].m_data + local_538 + -4));
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
        std::ios_base::~ios_base(local_168);
        uVar9 = 0xf;
        if (local_4f8 != &local_4e8) {
          uVar9 = local_4e8;
        }
        if (uVar9 < (ulong)(local_2c0 + local_4f0)) {
          uVar9 = 0xf;
          if (local_2c8 != local_2b8) {
            uVar9 = local_2b8[0];
          }
          if (uVar9 < (ulong)(local_2c0 + local_4f0)) goto LAB_0065d313;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_2c8,0,(char *)0x0,(ulong)local_4f8);
        }
        else {
LAB_0065d313:
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_4f8,(ulong)local_2c8);
        }
        local_530 = &local_520;
        puVar18 = puVar13 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar18) {
          local_520._M_allocated_capacity = *puVar18;
          local_520._8_8_ = puVar13[3];
        }
        else {
          local_520._M_allocated_capacity = *puVar18;
          local_530 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar13;
        }
        local_528 = puVar13[1];
        *puVar13 = puVar18;
        puVar13[1] = 0;
        *(undefined1 *)puVar18 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_530);
        local_568 = &local_558;
        puVar18 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar18) {
          local_558 = *puVar18;
          lStack_550 = plVar10[3];
        }
        else {
          local_558 = *puVar18;
          local_568 = (ulong *)*plVar10;
        }
        local_560 = plVar10[1];
        *plVar10 = (long)puVar18;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        local_1d8[0]._M_dataplus._M_p = (pointer)&local_1d8[0].field_2;
        std::__cxx11::string::_M_construct((ulong)local_1d8,'\x01');
        uVar9 = 0xf;
        if (local_568 != &local_558) {
          uVar9 = local_558;
        }
        if (uVar9 < local_1d8[0]._M_string_length + local_560) {
          uVar20 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8[0]._M_dataplus._M_p != &local_1d8[0].field_2) {
            uVar20 = local_1d8[0].field_2._M_allocated_capacity;
          }
          if ((ulong)uVar20 < local_1d8[0]._M_string_length + local_560) goto LAB_0065d461;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_1d8,0,(char *)0x0,(ulong)local_568);
        }
        else {
LAB_0065d461:
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_568,(ulong)local_1d8[0]._M_dataplus._M_p);
        }
        local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
        puVar18 = puVar13 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar18) {
          local_5b0.field_2._M_allocated_capacity = *puVar18;
          local_5b0.field_2._8_8_ = puVar13[3];
        }
        else {
          local_5b0.field_2._M_allocated_capacity = *puVar18;
          local_5b0._M_dataplus._M_p = (pointer)*puVar13;
        }
        local_5b0._M_string_length = puVar13[1];
        *puVar13 = puVar18;
        puVar13[1] = 0;
        *(undefined1 *)puVar18 = 0;
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_5b0);
        local_590 = &local_588._M_string_length;
        psVar16 = puVar13 + 2;
        if ((size_type *)*puVar13 == psVar16) {
          local_588._M_string_length = *psVar16;
          local_588.field_2._M_allocated_capacity = puVar13[3];
        }
        else {
          local_588._M_string_length = *psVar16;
          local_590 = (size_type *)*puVar13;
        }
        local_588._M_dataplus._M_p = (pointer)puVar13[1];
        *puVar13 = psVar16;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_4d8,(ulong)local_590);
        if (local_590 != &local_588._M_string_length) {
          operator_delete(local_590,local_588._M_string_length + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
          operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8[0]._M_dataplus._M_p != &local_1d8[0].field_2) {
          operator_delete(local_1d8[0]._M_dataplus._M_p,
                          local_1d8[0].field_2._M_allocated_capacity + 1);
        }
        if (local_568 != &local_558) {
          operator_delete(local_568,local_558 + 1);
        }
        if (local_530 != &local_520) {
          operator_delete(local_530,local_520._M_allocated_capacity + 1);
        }
        if (local_2c8 != local_2b8) {
          operator_delete(local_2c8,local_2b8[0] + 1);
        }
        if (local_4f8 != &local_4e8) {
          operator_delete(local_4f8,local_4e8 + 1);
        }
        if (local_410 != &local_400) {
          operator_delete(local_410,local_400 + 1);
        }
        if (local_328 != local_318) {
          operator_delete(local_328,local_318[0] + 1);
        }
        if (local_348 != &local_338) {
          operator_delete(local_348,local_338 + 1);
        }
        if (local_430 != &local_420) {
          operator_delete(local_430,local_420 + 1);
        }
        if (local_2a8 != local_298) {
          operator_delete(local_2a8,local_298[0] + 1);
        }
        if (local_368 != &local_358) {
          operator_delete(local_368,local_358 + 1);
        }
        if (local_450 != &local_440) {
          operator_delete(local_450,local_440 + 1);
        }
        if (local_308 != local_2f8) {
          operator_delete(local_308,local_2f8[0] + 1);
        }
        if (local_388 != &local_378) {
          operator_delete(local_388,local_378 + 1);
        }
        if (local_470 != &local_460) {
          operator_delete(local_470,local_460 + 1);
        }
        if (local_288 != local_278) {
          operator_delete(local_288,local_278[0] + 1);
        }
        if (local_3a8 != &local_398) {
          operator_delete(local_3a8,local_398 + 1);
        }
        if (local_490 != &local_480) {
          operator_delete(local_490,local_480 + 1);
        }
        if (local_2e8 != local_2d8) {
          operator_delete(local_2e8,local_2d8[0] + 1);
        }
        if (local_3c8 != &local_3b8) {
          operator_delete(local_3c8,local_3b8 + 1);
        }
        if (local_4b0 != &local_4a0) {
          operator_delete(local_4b0,local_4a0 + 1);
        }
        if (local_268 != local_258) {
          operator_delete(local_268,local_258[0] + 1);
        }
        if (local_3e8 != &local_3d8) {
          operator_delete(local_3e8,local_3d8 + 1);
        }
        if (local_238 != &local_228) {
          operator_delete(local_238,local_228 + 1);
        }
        uVar20 = local_1e8._M_allocated_capacity;
        _Var21._M_p = (pointer)local_1f8[0];
        if (local_1f8[0] != &local_1e8) {
LAB_0065db9c:
          operator_delete(_Var21._M_p,uVar20 + 1);
        }
      }
      else if (GVar3 == GATHERTYPE_OFFSET_DYNAMIC) {
        if (OVar4 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
LAB_0065c7ab:
          std::__cxx11::string::append((char *)&local_4d8);
          goto LAB_0065dba4;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
        std::ostream::operator<<(local_1d8,local_544);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
        std::ios_base::~ios_base(local_168);
        plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_530,0,(char *)0x0,0xb54e13);
        local_568 = &local_558;
        puVar18 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar18) {
          local_558 = *puVar18;
          lStack_550 = plVar10[3];
        }
        else {
          local_558 = *puVar18;
          local_568 = (ulong *)*plVar10;
        }
        local_560 = plVar10[1];
        *plVar10 = (long)puVar18;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_568);
        local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
        puVar18 = puVar13 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar18) {
          local_5b0.field_2._M_allocated_capacity = *puVar18;
          local_5b0.field_2._8_8_ = puVar13[3];
        }
        else {
          local_5b0.field_2._M_allocated_capacity = *puVar18;
          local_5b0._M_dataplus._M_p = (pointer)*puVar13;
        }
        local_5b0._M_string_length = puVar13[1];
        *puVar13 = puVar18;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
        std::ostream::operator<<(local_1d8,local_504);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
        std::ios_base::~ios_base(local_168);
        uVar20 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
          uVar20 = local_5b0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar20 < local_4f0 + local_5b0._M_string_length) {
          uVar9 = 0xf;
          if (local_4f8 != &local_4e8) {
            uVar9 = local_4e8;
          }
          if (uVar9 < local_4f0 + local_5b0._M_string_length) goto LAB_0065da82;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_4f8,0,(char *)0x0,(ulong)local_5b0._M_dataplus._M_p);
        }
        else {
LAB_0065da82:
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_5b0,(ulong)local_4f8);
        }
        local_590 = &local_588._M_string_length;
        psVar16 = puVar13 + 2;
        if ((size_type *)*puVar13 == psVar16) {
          local_588._M_string_length = *psVar16;
          local_588.field_2._M_allocated_capacity = puVar13[3];
        }
        else {
          local_588._M_string_length = *psVar16;
          local_590 = (size_type *)*puVar13;
        }
        local_588._M_dataplus._M_p = (pointer)puVar13[1];
        *puVar13 = psVar16;
        puVar13[1] = 0;
        *(undefined1 *)psVar16 = 0;
        std::__cxx11::string::_M_append((char *)&local_4d8,(ulong)local_590);
        if (local_590 != &local_588._M_string_length) {
          operator_delete(local_590,local_588._M_string_length + 1);
        }
        if (local_4f8 != &local_4e8) {
          operator_delete(local_4f8,local_4e8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
          operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
        }
        if (local_568 != &local_558) {
          operator_delete(local_568,local_558 + 1);
        }
        uVar20 = local_520._M_allocated_capacity;
        _Var21._M_p = (pointer)local_530;
        if (local_530 != &local_520) goto LAB_0065db9c;
      }
      else if (GVar3 == GATHERTYPE_OFFSET) {
        if (OVar4 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) goto LAB_0065c7ab;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
        tcu::operator<<((ostream *)local_1d8,
                        (Vector<int,_2> *)((long)pGVar6->offsets[0].m_data + local_538 + -0x1c));
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
        std::ios_base::~ios_base(local_168);
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_5b0,0,(char *)0x0,0xb54e34);
        local_590 = &local_588._M_string_length;
        psVar16 = puVar13 + 2;
        if ((size_type *)*puVar13 == psVar16) {
          local_588._M_string_length = *psVar16;
          local_588.field_2._M_allocated_capacity = puVar13[3];
        }
        else {
          local_588._M_string_length = *psVar16;
          local_590 = (size_type *)*puVar13;
        }
        local_588._M_dataplus._M_p = (pointer)puVar13[1];
        *puVar13 = psVar16;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_4d8,(ulong)local_590);
        if (local_590 != &local_588._M_string_length) {
          operator_delete(local_590,local_588._M_string_length + 1);
        }
        uVar20 = local_5b0.field_2._M_allocated_capacity;
        _Var21._M_p = local_5b0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0._M_dataplus._M_p == &local_5b0.field_2) goto LAB_0065dba4;
        goto LAB_0065db9c;
      }
LAB_0065dba4:
      if (IVar5 == IMAGE_BACKING_MODE_SPARSE) {
        std::__cxx11::string::append((char *)&local_4d8);
      }
      if (-1 < *(int *)((long)(pGVar6->offsets + -4) + local_538)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
        std::ostream::operator<<(local_1d8,*(int *)((long)(pGVar6->offsets + -4) + local_538));
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
        std::ios_base::~ios_base(local_168);
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_5b0,0,(char *)0x0,0xb680a1);
        local_590 = &local_588._M_string_length;
        psVar16 = puVar13 + 2;
        if ((size_type *)*puVar13 == psVar16) {
          local_588._M_string_length = *psVar16;
          local_588.field_2._M_allocated_capacity = puVar13[3];
        }
        else {
          local_588._M_string_length = *psVar16;
          local_590 = (size_type *)*puVar13;
        }
        local_588._M_dataplus._M_p = (pointer)puVar13[1];
        *puVar13 = psVar16;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_4d8,(ulong)local_590);
        if (local_590 != &local_588._M_string_length) {
          operator_delete(local_590,local_588._M_string_length + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
          operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::append((char *)&local_4d8);
      GVar3 = local_540->gatherType;
      OVar4 = local_540->offsetSize;
      IVar5 = local_540->sparseCase;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      std::ostream::operator<<(local_1d8,local_500);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
      std::ios_base::~ios_base(local_168);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_568,0,(char *)0x0,0xb4dcfe);
      local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
      psVar16 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_5b0.field_2._M_allocated_capacity = *psVar16;
        local_5b0.field_2._8_8_ = plVar10[3];
      }
      else {
        local_5b0.field_2._M_allocated_capacity = *psVar16;
        local_5b0._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_5b0._M_string_length = plVar10[1];
      *plVar10 = (long)psVar16;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      if (local_568 != &local_558) {
        operator_delete(local_568,local_558 + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      DVar8 = TYPE_LAST;
      if ((uint)local_240 < 0x18) {
        DVar8 = *(DataType *)(&DAT_00b547d8 + local_240 * 4);
      }
      pcVar14 = glu::getDataTypeName(DVar8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_568,pcVar14,(allocator<char> *)&local_530);
      lVar19 = 0x10;
      pcVar14 = "#version 310 es\n";
      if (IVar5 == IMAGE_BACKING_MODE_SPARSE) {
        lVar19 = 0x2c;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,"#version 450\n",0xd);
        pcVar14 = "#extension GL_ARB_sparse_texture2 : require\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,pcVar14,lVar19);
      if ((GVar3 & ~GATHERTYPE_OFFSET) == GATHERTYPE_OFFSET_DYNAMIC ||
          OVar4 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,"#extension GL_EXT_gpu_shader5 : require\n",0x28);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"\nlayout (location = 0) out mediump ",0x23);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,(char *)local_568,local_560);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11," o_color;\n\nlayout (location = 0) in highp ",0x2a);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,local_5b0._M_dataplus._M_p,local_5b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," v_texCoord;\n",0xd);
      if (bVar22) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,"layout (location = 1) in highp vec2 v_normalizedCoord;\n",
                   0x37);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"\nlayout (binding = ",0x13);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,") uniform highp ",0x10);
      pcVar14 = glu::getDataTypeName((DataType)local_510);
      if (pcVar14 == (char *)0x0) {
        std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
      }
      else {
        sVar15 = strlen(pcVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar14,sVar15);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," u_sampler;\n",0xc);
      if (local_4fc == GATHERTYPE_OFFSET_DYNAMIC) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,"layout (binding = ",0x12);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,") uniform viewportSize { highp vec2 u_viewportSize; };\n",0x37);
      }
      if (OVar4 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,"layout (binding = ",0x12);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,") uniform offset { highp ivec2 u_offset; };\n",0x2c);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"\nvoid main(void)\n{\n",0x13);
      if (local_4fc == GATHERTYPE_OFFSET_DYNAMIC) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,
                   "\tivec2 pixCoord = ivec2(v_normalizedCoord*u_viewportSize);\n",0x3b);
      }
      if (IVar5 == IMAGE_BACKING_MODE_SPARSE) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"\t",1);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1d8,(char *)local_568,local_560);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," texel;\n",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,"\tint success = ",0xf);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1d8,local_4d8,local_4d0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,";\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,"\tif (sparseTexelsResidentARB(success))\n",0x27);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,"\t\to_color = texel;\n",0x13);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"\telse\n",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,"\t\to_color = ",0xc);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1d8,(char *)local_568,local_560);
        lVar19 = 0x16;
        pcVar14 = "(0.0, 0.0, 0.0, 1.0);\n";
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,"\t\to_color = ",0xc);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1d8,local_4d8,local_4d0);
        lVar19 = 2;
        pcVar14 = ";\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar14,lVar19);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"}\n",2);
      std::__cxx11::stringbuf::str();
      local_590 = (size_type *)CONCAT44(local_590._4_4_,1);
      local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_588,local_530,(undefined1 *)(local_528 + (long)local_530));
      if (local_530 != &local_520) {
        operator_delete(local_530,local_520._M_allocated_capacity + 1);
      }
      if (local_568 != &local_558) {
        operator_delete(local_568,local_558 + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
      std::ios_base::~ios_base(local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
        operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      std::ostream::operator<<(local_1d8,(int)local_3f0);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
      std::ios_base::~ios_base(local_168);
      puVar13 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_568,0,(char *)0x0,0xb54bab);
      local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
      puVar18 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar18) {
        local_5b0.field_2._M_allocated_capacity = *puVar18;
        local_5b0.field_2._8_8_ = puVar13[3];
      }
      else {
        local_5b0.field_2._M_allocated_capacity = *puVar18;
        local_5b0._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_5b0._M_string_length = puVar13[1];
      *puVar13 = puVar18;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      pPVar12 = ::vk::ProgramCollection<glu::ProgramSources>::add
                          (&local_248->glslSources,&local_5b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pPVar12->sources + ((ulong)local_590 & 0xffffffff),&local_588);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
        operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
      }
      if (local_568 != &local_558) {
        operator_delete(local_568,local_558 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_588._M_dataplus._M_p != &local_588.field_2) {
        operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
      }
      if (local_4d8 != &local_4c8) {
        operator_delete(local_4d8,CONCAT71(uStack_4c7,local_4c8) + 1);
      }
      local_3f0 = local_3f0 + 1;
      local_538 = local_538 + 0x24;
    } while (local_4b8 != local_3f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void genGatherPrograms (vk::SourceCollections& programCollection, const GatherCaseBaseParams& baseParams, const vector<GatherArgs>& iterations)
{
	const int					numIterations		= (int)iterations.size();
	const string				refZExpr			= "v_normalizedCoord.x";
	const IVec2&				offsetRange			= baseParams.offsetSize != OFFSETSIZE_IMPLEMENTATION_MAXIMUM ? getOffsetRange(baseParams.offsetSize) : IVec2(0);
	const bool					usePixCoord			= baseParams.gatherType == GATHERTYPE_OFFSET_DYNAMIC;
	const bool					useNormalizedCoord	= usePixCoord || isDepthFormat(baseParams.textureFormat);
	const bool					isDynamicOffset		= baseParams.gatherType == GATHERTYPE_OFFSET_DYNAMIC;
	const bool					isShadow			= isDepthFormat(baseParams.textureFormat);
	const glu::DataType			samplerType			= getSamplerType(baseParams.textureType, baseParams.textureFormat);
	const int					numDims				= getNumTextureSamplingDimensions(baseParams.textureType);
	glu::VertexSource			vert				= genVertexShaderSource(requireGpuShader5(baseParams.gatherType, baseParams.offsetSize), numDims, isDynamicOffset || isShadow);

	programCollection.glslSources.add("vert") << vert;

	for (int iterNdx = 0; iterNdx < numIterations; iterNdx++)
	{
		const GatherArgs&		gatherArgs			= iterations[iterNdx];
		const string			funcCall			= genGatherFuncCall(baseParams.gatherType, baseParams.textureFormat, gatherArgs, refZExpr, offsetRange, 1, baseParams.offsetSize, baseParams.sparseCase);
		glu::FragmentSource		frag				= genFragmentShaderSource(requireGpuShader5(baseParams.gatherType, baseParams.offsetSize), numDims, samplerType, funcCall, useNormalizedCoord, usePixCoord, baseParams.offsetSize, baseParams.sparseCase);

		programCollection.glslSources.add("frag_" + de::toString(iterNdx)) << frag;
	}
}